

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

int64_t pick_interintra_wedge(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,uint8_t *p0,uint8_t *p1)

{
  int iVar1;
  int64_t iVar2;
  uint8_t *in_RCX;
  byte in_DL;
  long in_RSI;
  uint8_t *in_R8;
  int64_t rd;
  uint64_t sse;
  int8_t wedge_index;
  int16_t diff10 [16384];
  int16_t residual1 [16384];
  int bh;
  int bw;
  buf_2d *src;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  ptrdiff_t in_stack_fffffffffffeff58;
  uint8_t *in_stack_fffffffffffeff60;
  ptrdiff_t in_stack_fffffffffffeff68;
  int16_t *in_stack_fffffffffffeff70;
  int in_stack_fffffffffffeff78;
  int in_stack_fffffffffffeff7c;
  undefined1 uVar3;
  int16_t aiStack_10080 [4];
  uint8_t *in_stack_fffffffffffeff88;
  ptrdiff_t in_stack_fffffffffffeff90;
  int8_t in_stack_fffffffffffeffa7;
  int16_t *in_stack_fffffffffffeffa8;
  int16_t *in_stack_fffffffffffeffb0;
  BLOCK_SIZE in_stack_fffffffffffeffbf;
  MACROBLOCK *in_stack_fffffffffffeffc0;
  AV1_COMP *in_stack_fffffffffffeffc8;
  int8_t *in_stack_fffffffffffeffd8;
  uint64_t *in_stack_fffffffffffeffe0;
  int16_t local_8080 [16388];
  uint local_78;
  uint local_74;
  undefined8 *local_70;
  long local_68;
  MACROBLOCKD *local_60;
  uint8_t *local_58;
  uint8_t *local_50;
  
  local_60 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  local_68 = **(long **)(in_RSI + 0x2058);
  local_70 = (undefined8 *)(in_RSI + 0x30);
  local_74 = (uint)block_size_wide[in_DL];
  local_78 = (uint)block_size_high[in_DL];
  local_58 = in_R8;
  local_50 = in_RCX;
  iVar1 = is_cur_buf_hbd(local_60);
  if (iVar1 == 0) {
    (*aom_subtract_block)
              (local_78,local_74,local_8080,(long)(int)local_74,(uint8_t *)*local_70,
               (long)*(int *)(local_70 + 3),local_58,(long)(int)local_74);
    (*aom_subtract_block)
              (local_78,local_74,aiStack_10080,(long)(int)local_74,local_58,(long)(int)local_74,
               local_50,(long)(int)local_74);
  }
  else {
    aom_highbd_subtract_block_sse2
              (in_stack_fffffffffffeff7c,in_stack_fffffffffffeff78,in_stack_fffffffffffeff70,
               in_stack_fffffffffffeff68,in_stack_fffffffffffeff60,in_stack_fffffffffffeff58,
               in_stack_fffffffffffeff88,in_stack_fffffffffffeff90);
    aom_highbd_subtract_block_sse2
              (in_stack_fffffffffffeff7c,in_stack_fffffffffffeff78,in_stack_fffffffffffeff70,
               in_stack_fffffffffffeff68,in_stack_fffffffffffeff60,in_stack_fffffffffffeff58,
               in_stack_fffffffffffeff88,in_stack_fffffffffffeff90);
  }
  uVar3 = 0xff;
  iVar2 = pick_wedge_fixed_sign
                    (in_stack_fffffffffffeffc8,in_stack_fffffffffffeffc0,in_stack_fffffffffffeffbf,
                     in_stack_fffffffffffeffb0,in_stack_fffffffffffeffa8,in_stack_fffffffffffeffa7,
                     in_stack_fffffffffffeffd8,in_stack_fffffffffffeffe0);
  *(undefined1 *)(local_68 + 0x41) = uVar3;
  return iVar2;
}

Assistant:

static int64_t pick_interintra_wedge(const AV1_COMP *const cpi,
                                     const MACROBLOCK *const x,
                                     const BLOCK_SIZE bsize,
                                     const uint8_t *const p0,
                                     const uint8_t *const p1) {
  const MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(av1_is_wedge_used(bsize));
  assert(cpi->common.seq_params->enable_interintra_compound);

  const struct buf_2d *const src = &x->plane[0].src;
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  DECLARE_ALIGNED(32, int16_t, residual1[MAX_SB_SQUARE]);  // src - pred1
  DECLARE_ALIGNED(32, int16_t, diff10[MAX_SB_SQUARE]);     // pred1 - pred0
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    aom_highbd_subtract_block(bh, bw, residual1, bw, src->buf, src->stride,
                              CONVERT_TO_BYTEPTR(p1), bw);
    aom_highbd_subtract_block(bh, bw, diff10, bw, CONVERT_TO_BYTEPTR(p1), bw,
                              CONVERT_TO_BYTEPTR(p0), bw);
  } else {
    aom_subtract_block(bh, bw, residual1, bw, src->buf, src->stride, p1, bw);
    aom_subtract_block(bh, bw, diff10, bw, p1, bw, p0, bw);
  }
#else
  aom_subtract_block(bh, bw, residual1, bw, src->buf, src->stride, p1, bw);
  aom_subtract_block(bh, bw, diff10, bw, p1, bw, p0, bw);
#endif
  int8_t wedge_index = -1;
  uint64_t sse;
  int64_t rd = pick_wedge_fixed_sign(cpi, x, bsize, residual1, diff10, 0,
                                     &wedge_index, &sse);

  mbmi->interintra_wedge_index = wedge_index;
  return rd;
}